

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
kj::ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Embargo>::truncate
          (ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Embargo> *this,char *__file,
          __off_t __length)

{
  Embargo *pEVar1;
  PromiseFulfiller<void> *pPVar2;
  Disposer *pDVar3;
  Embargo *pEVar4;
  Embargo *pEVar5;
  
  pEVar1 = this->ptr;
  pEVar5 = this->pos;
  while (pEVar4 = pEVar5, pEVar1 + (long)__file < pEVar4) {
    this->pos = pEVar4 + -1;
    pPVar2 = pEVar4[-1].fulfiller.ptr.ptr;
    pEVar5 = pEVar4 + -1;
    if (pPVar2 != (PromiseFulfiller<void> *)0x0) {
      pEVar4[-1].fulfiller.ptr.ptr = (PromiseFulfiller<void> *)0x0;
      pDVar3 = pEVar4[-1].fulfiller.ptr.disposer;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[-2] +
                        (long)&(pPVar2->super_PromiseRejector)._vptr_PromiseRejector);
      pEVar5 = this->pos;
    }
  }
  return (int)pEVar4;
}

Assistant:

void truncate(size_t size) {
    KJ_IREQUIRE(size <= this->size(), "can't use truncate() to expand");

    T* target = ptr + size;
    if (KJ_HAS_TRIVIAL_DESTRUCTOR(T)) {
      // const_cast is safe here because the member won't ever be dereferenced because it
      // points to the end of the segment.
      pos = const_cast<RemoveConst<T>*>(target);
    } else {
      while (pos > target) {
        kj::dtor(*--pos);
      }
    }
  }